

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

Vec_Wrd_t * Gia_ManSimPatSim(Gia_Man_t *pGia)

{
  int iVar1;
  Vec_Wrd_t *vSimsIn;
  Vec_Int_t *pVVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  int *piVar5;
  int nWords;
  Vec_Wrd_t *vSims;
  word *__s;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  word *pwVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  word *pSims;
  
  vSimsIn = pGia->vSimsPi;
  pVVar2 = pGia->vCis;
  uVar7 = (long)vSimsIn->nSize / (long)pVVar2->nSize;
  nWords = (int)uVar7;
  lVar13 = (long)pGia->nObjs * (long)nWords;
  vSims = (Vec_Wrd_t *)malloc(0x10);
  iVar1 = (int)lVar13;
  iVar6 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  vSims->nSize = 0;
  vSims->nCap = iVar6;
  if (iVar6 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)iVar6 << 3);
  }
  vSims->pArray = __s;
  vSims->nSize = iVar1;
  memset(__s,0,lVar13 * 8);
  if (vSimsIn->nSize % pVVar2->nSize == 0) {
    Gia_ManSimPatAssignInputs(pGia,nWords,vSims,vSimsIn);
    iVar1 = pGia->nObjs;
    uVar7 = uVar7 & 0xffffffff;
    if ((0 < (long)iVar1) && (pGVar3 = pGia->pObjs, pGVar3 != (Gia_Obj_t *)0x0)) {
      lVar13 = 0;
      pwVar10 = __s;
      do {
        uVar4 = *(ulong *)(pGVar3 + lVar13);
        uVar12 = (uint)uVar4;
        if ((~uVar12 & 0x1fffffff) != 0 && -1 < (int)uVar12) {
          uVar14 = *(ulong *)((long)Cnf_CutDeriveTruth::C + (ulong)((uint)(uVar4 >> 0x1a) & 8));
          uVar11 = (uint)(uVar4 >> 0x20);
          uVar4 = Cnf_CutDeriveTruth::C[uVar11 >> 0x1d & 1];
          uVar12 = uVar12 & 0x1fffffff;
          uVar11 = uVar11 & 0x1fffffff;
          iVar6 = (int)lVar13;
          if (uVar12 < uVar11) {
            if (0 < nWords) {
              uVar8 = 0;
              do {
                pwVar10[uVar8] =
                     __s[(long)(int)((iVar6 - uVar12) * nWords) + uVar8] ^
                     __s[(long)(int)((iVar6 - uVar11) * nWords) + uVar8] ^ uVar14 ^ uVar4;
                uVar8 = uVar8 + 1;
              } while (uVar7 != uVar8);
            }
          }
          else if (0 < nWords) {
            uVar8 = 0;
            do {
              pwVar10[uVar8] =
                   (__s[(long)(int)((iVar6 - uVar11) * nWords) + uVar8] ^ uVar4) &
                   (__s[(long)(int)((iVar6 - uVar12) * nWords) + uVar8] ^ uVar14);
              uVar8 = uVar8 + 1;
            } while (uVar7 != uVar8);
          }
        }
        lVar13 = lVar13 + 1;
        pwVar10 = pwVar10 + nWords;
      } while (lVar13 != iVar1);
    }
    lVar13 = (long)pGia->vCos->nSize;
    if (0 < lVar13) {
      piVar5 = pGia->vCos->pArray;
      lVar9 = 0;
      do {
        iVar6 = piVar5[lVar9];
        if (((long)iVar6 < 0) || (iVar1 <= iVar6)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pGia->pObjs == (Gia_Obj_t *)0x0) {
          return vSims;
        }
        if (0 < nWords) {
          uVar12 = *(uint *)(pGia->pObjs + iVar6);
          uVar4 = *(ulong *)((long)Cnf_CutDeriveTruth::C + (ulong)(uVar12 >> 0x1a & 8));
          uVar14 = 0;
          do {
            __s[(long)(iVar6 * nWords) + uVar14] =
                 __s[(long)(int)((iVar6 - (uVar12 & 0x1fffffff)) * nWords) + uVar14] ^ uVar4;
            uVar14 = uVar14 + 1;
          } while (uVar7 != uVar14);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != lVar13);
    }
    return vSims;
  }
  __assert_fail("Vec_WrdSize(pGia->vSimsPi) % Gia_ManCiNum(pGia) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                ,0x81,"Vec_Wrd_t *Gia_ManSimPatSim(Gia_Man_t *)");
}

Assistant:

Vec_Wrd_t * Gia_ManSimPatSim( Gia_Man_t * pGia )
{
    Gia_Obj_t * pObj;
    int i, nWords = Vec_WrdSize(pGia->vSimsPi) / Gia_ManCiNum(pGia);
    Vec_Wrd_t * vSims = Vec_WrdStart( Gia_ManObjNum(pGia) * nWords );
    assert( Vec_WrdSize(pGia->vSimsPi) % Gia_ManCiNum(pGia) == 0 );
    Gia_ManSimPatAssignInputs( pGia, nWords, vSims, pGia->vSimsPi );
    Gia_ManForEachAnd( pGia, pObj, i ) 
        Gia_ManSimPatSimAnd( pGia, i, pObj, nWords, vSims );
    Gia_ManForEachCo( pGia, pObj, i )
        Gia_ManSimPatSimPo( pGia, Gia_ObjId(pGia, pObj), pObj, nWords, vSims );
    return vSims;
}